

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall QTreeViewPrivate::itemAtCoordinate(QTreeViewPrivate *this,int coordinate)

{
  int iVar1;
  int iVar2;
  int iVar3;
  qsizetype qVar4;
  int in_ESI;
  long in_RDI;
  int viewItemIndex_4;
  int viewItemCoordinate_2;
  int viewItemIndex_3;
  int viewItemCoordinate_1;
  int viewItemIndex_2;
  int topViewItemIndex;
  int viewItemIndex_1;
  int contentsCoordinate;
  int viewItemCoordinate;
  int viewItemIndex;
  int itemCount;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int local_50;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_28;
  int local_20;
  int local_14;
  
  qVar4 = QList<QTreeViewItem>::size((QList<QTreeViewItem> *)(in_RDI + 0x5a0));
  iVar1 = (int)qVar4;
  if ((iVar1 != 0) && (((*(byte *)(in_RDI + 0x5c0) & 1) == 0 || (0 < *(int *)(in_RDI + 0x5bc))))) {
    if (*(int *)(in_RDI + 0x458) == 1) {
      if ((*(byte *)(in_RDI + 0x5c0) & 1) != 0) {
        iVar2 = QAbstractSlider::value
                          ((QAbstractSlider *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        local_50 = (in_ESI + iVar2) / *(int *)(in_RDI + 0x5bc);
        if ((iVar1 <= local_50) || (local_50 < 0)) {
          local_50 = -1;
        }
        return local_50;
      }
      local_20 = 0;
      iVar2 = QAbstractSlider::value
                        ((QAbstractSlider *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      for (local_28 = 0;
          qVar4 = QList<QTreeViewItem>::size((QList<QTreeViewItem> *)(in_RDI + 0x5a0)),
          local_28 < qVar4; local_28 = local_28 + 1) {
        iVar3 = itemHeight((QTreeViewPrivate *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                           in_stack_ffffffffffffff94);
        local_20 = iVar3 + local_20;
        if (in_ESI + iVar2 < local_20) {
          if (iVar1 <= local_28) {
            return -1;
          }
          return local_28;
        }
      }
    }
    else {
      local_40 = QAbstractSlider::value
                           ((QAbstractSlider *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      if ((*(byte *)(in_RDI + 0x5c0) & 1) != 0) {
        local_14 = in_ESI;
        if (in_ESI < 0) {
          local_14 = in_ESI - (*(int *)(in_RDI + 0x5bc) + -1);
        }
        local_40 = local_40 + local_14 / *(int *)(in_RDI + 0x5bc);
        if ((local_40 < iVar1) && (-1 < local_40)) {
          return local_40;
        }
        return -1;
      }
      if (in_ESI < 0) {
        local_3c = 0;
        for (; -1 < local_40; local_40 = local_40 + -1) {
          if (local_3c <= in_ESI) {
            if (iVar1 <= local_40) {
              return -1;
            }
            return local_40;
          }
          iVar2 = itemHeight((QTreeViewPrivate *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             in_stack_ffffffffffffff94);
          local_3c = local_3c - iVar2;
        }
      }
      else {
        local_34 = 0;
        for (local_38 = local_40;
            qVar4 = QList<QTreeViewItem>::size((QList<QTreeViewItem> *)(in_RDI + 0x5a0)),
            local_38 < qVar4; local_38 = local_38 + 1) {
          iVar2 = itemHeight((QTreeViewPrivate *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             in_stack_ffffffffffffff94);
          local_34 = iVar2 + local_34;
          if (in_ESI < local_34) {
            if (iVar1 <= local_38) {
              return -1;
            }
            return local_38;
          }
        }
      }
    }
  }
  return -1;
}

Assistant:

int QTreeViewPrivate::itemAtCoordinate(int coordinate) const
{
    const int itemCount = viewItems.size();
    if (itemCount == 0)
        return -1;
    if (uniformRowHeights && defaultItemHeight <= 0)
        return -1;
    if (verticalScrollMode == QAbstractItemView::ScrollPerPixel) {
        if (uniformRowHeights) {
            const int viewItemIndex = (coordinate + vbar->value()) / defaultItemHeight;
            return ((viewItemIndex >= itemCount || viewItemIndex < 0) ? -1 : viewItemIndex);
        }
        // ### optimize
        int viewItemCoordinate = 0;
        const int contentsCoordinate = coordinate + vbar->value();
        for (int viewItemIndex = 0; viewItemIndex < viewItems.size(); ++viewItemIndex) {
            viewItemCoordinate += itemHeight(viewItemIndex);
            if (viewItemCoordinate > contentsCoordinate)
                return (viewItemIndex >= itemCount ? -1 : viewItemIndex);
        }
    } else { // ScrollPerItem
        int topViewItemIndex = vbar->value();
        if (uniformRowHeights) {
            if (coordinate < 0)
                coordinate -= defaultItemHeight - 1;
            const int viewItemIndex = topViewItemIndex + (coordinate / defaultItemHeight);
            return ((viewItemIndex >= itemCount || viewItemIndex < 0) ? -1 : viewItemIndex);
        }
        if (coordinate >= 0) {
            // the coordinate is in or below the viewport
            int viewItemCoordinate = 0;
            for (int viewItemIndex = topViewItemIndex; viewItemIndex < viewItems.size(); ++viewItemIndex) {
                viewItemCoordinate += itemHeight(viewItemIndex);
                if (viewItemCoordinate > coordinate)
                    return (viewItemIndex >= itemCount ? -1 : viewItemIndex);
            }
        } else {
            // the coordinate is above the viewport
            int viewItemCoordinate = 0;
            for (int viewItemIndex = topViewItemIndex; viewItemIndex >= 0; --viewItemIndex) {
                if (viewItemCoordinate <= coordinate)
                    return (viewItemIndex >= itemCount ? -1 : viewItemIndex);
                viewItemCoordinate -= itemHeight(viewItemIndex);
            }
        }
    }
    return -1;
}